

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_hmac_sha256(void)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_hash_context_t *ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint8_t digest [32];
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char local_28;
  char cStack_27;
  char cStack_26;
  char cStack_25;
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  
  ppVar1 = find_aes128gcmsha256(ctx);
  ppVar2 = ptls_hmac_create(ppVar1->hash,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x14);
  (*ppVar2->update)(ppVar2,"Hi There",8);
  (*ppVar2->final)(ppVar2,&local_38,PTLS_HASH_FINAL_MODE_FREE);
  auVar3[0] = -(local_28 == -0x78);
  auVar3[1] = -(cStack_27 == '\x1d');
  auVar3[2] = -(cStack_26 == -0x3e);
  auVar3[3] = -(cStack_25 == '\0');
  auVar3[4] = -(cStack_24 == -0x37);
  auVar3[5] = -(cStack_23 == -0x7d);
  auVar3[6] = -(cStack_22 == '=');
  auVar3[7] = -(cStack_21 == -0x59);
  auVar3[8] = -(cStack_20 == '&');
  auVar3[9] = -(cStack_1f == -0x17);
  auVar3[10] = -(cStack_1e == '7');
  auVar3[0xb] = -(cStack_1d == 'l');
  auVar3[0xc] = -(cStack_1c == '.');
  auVar3[0xd] = -(cStack_1b == '2');
  auVar3[0xe] = -(cStack_1a == -0x31);
  auVar3[0xf] = -(cStack_19 == -9);
  auVar4[0] = -(local_38 == -0x50);
  auVar4[1] = -(cStack_37 == '4');
  auVar4[2] = -(cStack_36 == 'L');
  auVar4[3] = -(cStack_35 == 'a');
  auVar4[4] = -(cStack_34 == -0x28);
  auVar4[5] = -(cStack_33 == -0x25);
  auVar4[6] = -(cStack_32 == '8');
  auVar4[7] = -(cStack_31 == 'S');
  auVar4[8] = -(cStack_30 == '\\');
  auVar4[9] = -(cStack_2f == -0x58);
  auVar4[10] = -(cStack_2e == -0x51);
  auVar4[0xb] = -(cStack_2d == -0x32);
  auVar4[0xc] = -(cStack_2c == -0x51);
  auVar4[0xd] = -(cStack_2b == '\v');
  auVar4[0xe] = -(cStack_2a == -0xf);
  auVar4[0xf] = -(cStack_29 == '+');
  auVar4 = auVar4 & auVar3;
  _ok((uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x34);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There";
    uint8_t digest[32];

    ptls_hash_context_t *hctx = ptls_hmac_create(find_aes128gcmsha256(ctx)->hash, secret, strlen(secret));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, 0);

    ok(memcmp(digest, "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                      "\x6c\x2e\x32\xcf\xf7",
              32) == 0);
}